

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<256u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<256u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  char cVar1;
  unsigned_fast_type uVar2;
  undefined8 uVar3;
  bool bVar4;
  size_type_conflict sVar5;
  uint uVar6;
  const_iterator puVar7;
  byte *pbVar8;
  reference pcVar9;
  size_type sVar10;
  pointer pcVar11;
  uintwide_t<256U,_unsigned_int,_void,_false> *v;
  reference pcVar12;
  pointer pcVar13;
  reference pcVar14;
  pointer pcVar15;
  char local_281;
  unsigned_long local_228;
  unsigned_fast_type local_220;
  unsigned_fast_type dst;
  signed_fast_type pos_2;
  string_storage_hex_type str_temp_2;
  uintwide_t<256U,_unsigned_int,_void,_false> t_2;
  uintwide_t<256U,_unsigned_int,_void,_false> local_1a0;
  uintwide_t<256U,_unsigned_int,_void,_false> local_180;
  undefined1 local_160 [8];
  uintwide_t<256U,_unsigned_int,_void,_false> tmp;
  signed_fast_type pos_1;
  string_storage_dec_type str_temp_1;
  bool str_has_neg_sign;
  uintwide_t<256U,_unsigned_int,_void,_false> t_1;
  byte local_b1;
  ulong uStack_b0;
  char c;
  signed_fast_type pos;
  string_storage_oct_type str_temp;
  limb_type mask;
  uintwide_t<256U,_unsigned_int,_void,_false> t;
  bool wr_string_is_ok;
  bool is_uppercase_local;
  bool show_pos_local;
  bool show_base_local;
  uint_fast8_t base_rep_local;
  char *str_result_local;
  uintwide_t<256U,_unsigned_int,_void,_false> *this_local;
  
  t.values.super_array<unsigned_int,_8UL>.elems[6]._3_1_ = true;
  if (base_rep == '\b') {
    unique0x00012000 = *(undefined8 *)this;
    str_temp.super_array<char,_94UL>.elems[0x56] = '\a';
    str_temp.super_array<char,_94UL>.elems[0x57] = '\0';
    str_temp.super_array<char,_94UL>.elems[0x58] = '\0';
    str_temp.super_array<char,_94UL>.elems[0x59] = '\0';
    memset((void *)((long)&pos + 6),0,0x5e);
    detail::fixed_static_array<char,_94U>::fixed_static_array
              ((fixed_static_array<char,_94U> *)((long)&pos + 6));
    sVar5 = detail::fixed_static_array<char,_94U>::static_size();
    uStack_b0 = (ulong)(sVar5 - 1);
    bVar4 = uintwide_t<256U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                       (str_temp.super_array<char,_94UL>.elems + 0x5a));
    if (bVar4) {
      uStack_b0 = uStack_b0 - 1;
      pcVar9 = detail::fixed_static_array<char,_94U>::operator[]
                         ((fixed_static_array<char,_94U> *)((long)&pos + 6),
                          (size_type_conflict)uStack_b0);
      *pcVar9 = '0';
    }
    else {
      while (bVar4 = uintwide_t<256U,_unsigned_int,_void,_false>::is_zero
                               ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                                (str_temp.super_array<char,_94UL>.elems + 0x5a)),
            !bVar4 && 0 < (long)uStack_b0) {
        puVar7 = detail::array_detail::array<unsigned_int,_8UL>::cbegin
                           ((array<unsigned_int,_8UL> *)
                            (str_temp.super_array<char,_94UL>.elems + 0x5a));
        local_b1 = (byte)*puVar7 & 7;
        if (local_b1 < 9) {
          local_b1 = local_b1 + 0x30;
        }
        uStack_b0 = uStack_b0 - 1;
        pbVar8 = (byte *)detail::fixed_static_array<char,_94U>::operator[]
                                   ((fixed_static_array<char,_94U> *)((long)&pos + 6),
                                    (size_type_conflict)uStack_b0);
        *pbVar8 = local_b1;
        operator>>=((uintwide_t<256u,unsigned_int,void,false> *)
                    (str_temp.super_array<char,_94UL>.elems + 0x5a),3);
      }
    }
    if ((show_base) && (0 < (long)uStack_b0)) {
      uStack_b0 = uStack_b0 - 1;
      pcVar9 = detail::fixed_static_array<char,_94U>::operator[]
                         ((fixed_static_array<char,_94U> *)((long)&pos + 6),
                          (size_type_conflict)uStack_b0);
      *pcVar9 = '0';
    }
    if ((show_pos) && (0 < (long)uStack_b0)) {
      uStack_b0 = uStack_b0 - 1;
      pcVar9 = detail::fixed_static_array<char,_94U>::operator[]
                         ((fixed_static_array<char,_94U> *)((long)&pos + 6),
                          (size_type_conflict)uStack_b0);
      *pcVar9 = '+';
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_94UL>::size();
      t_1.values.super_array<unsigned_int,_8UL>.elems._24_8_ = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)
                               (t_1.values.super_array<unsigned_int,_8UL>.elems + 6));
      while (sVar10 = detail::array_detail::array<char,_94UL>::size(), cVar1 = fill_char_str,
            (long)((sVar10 - 1) - field_width) < (long)uStack_b0) {
        uStack_b0 = uStack_b0 - 1;
        pcVar9 = detail::fixed_static_array<char,_94U>::operator[]
                           ((fixed_static_array<char,_94U> *)((long)&pos + 6),
                            (size_type_conflict)uStack_b0);
        *pcVar9 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_94UL>::size();
    pcVar9 = detail::fixed_static_array<char,_94U>::operator[]
                       ((fixed_static_array<char,_94U> *)((long)&pos + 6),(int)sVar10 - 1);
    *pcVar9 = '\0';
    pcVar11 = detail::array_detail::array<char,_94UL>::data((array<char,_94UL> *)((long)&pos + 6));
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar11 + uStack_b0);
  }
  else if (base_rep == '\n') {
    unique0x00012000 = *(undefined8 *)this;
    t_1.values.super_array<unsigned_int,_8UL>.elems._0_8_ = *(undefined8 *)(this + 8);
    t_1.values.super_array<unsigned_int,_8UL>.elems._8_8_ = *(undefined8 *)(this + 0x10);
    t_1.values.super_array<unsigned_int,_8UL>.elems._16_8_ = *(undefined8 *)(this + 0x18);
    str_temp_1.super_array<char,_87UL>.elems[0x4f] = '\0';
    memset(&pos_1,0,0x57);
    detail::fixed_static_array<char,_87U>::fixed_static_array
              ((fixed_static_array<char,_87U> *)&pos_1);
    sVar5 = detail::fixed_static_array<char,_87U>::static_size();
    tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ = ZEXT48(sVar5 - 1);
    bVar4 = uintwide_t<256U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                       (str_temp_1.super_array<char,_87UL>.elems + 0x50));
    if (bVar4) {
      tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
           tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ + -1;
      pcVar12 = detail::fixed_static_array<char,_87U>::operator[]
                          ((fixed_static_array<char,_87U> *)&pos_1,
                           (size_type_conflict)
                           tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_);
      *pcVar12 = '0';
    }
    else {
      while (bVar4 = uintwide_t<256U,_unsigned_int,_void,_false>::is_zero
                               ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                                (str_temp_1.super_array<char,_87UL>.elems + 0x50)),
            uVar3 = stack0xffffffffffffff20,
            !bVar4 && 0 < (long)tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_) {
        local_160[0] = str_temp_1.super_array<char,_87UL>.elems[0x50];
        local_160[1] = str_temp_1.super_array<char,_87UL>.elems[0x51];
        local_160[2] = str_temp_1.super_array<char,_87UL>.elems[0x52];
        local_160[3] = str_temp_1.super_array<char,_87UL>.elems[0x53];
        local_160._4_4_ = stack0xffffffffffffff24;
        tmp.values.super_array<unsigned_int,_8UL>.elems[0] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[0];
        tmp.values.super_array<unsigned_int,_8UL>.elems[1] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[1];
        tmp.values.super_array<unsigned_int,_8UL>.elems[2] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[2];
        tmp.values.super_array<unsigned_int,_8UL>.elems[3] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[3];
        tmp.values.super_array<unsigned_int,_8UL>.elems[4] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[4];
        tmp.values.super_array<unsigned_int,_8UL>.elems[5] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[5];
        unique0x100008d8 = uVar3;
        uintwide_t<256U,_unsigned_int,_void,_false>::eval_divide_by_single_limb
                  ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                   (str_temp_1.super_array<char,_87UL>.elems + 0x50),10,0,
                   (uintwide_t<256U,_unsigned_int,_void,_false> *)0x0);
        uVar3 = stack0xffffffffffffff20;
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[0]._0_1_ =
             str_temp_1.super_array<char,_87UL>.elems[0x50];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[0]._1_1_ =
             str_temp_1.super_array<char,_87UL>.elems[0x51];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[0]._2_1_ =
             str_temp_1.super_array<char,_87UL>.elems[0x52];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[0]._3_1_ =
             str_temp_1.super_array<char,_87UL>.elems[0x53];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[1] = stack0xffffffffffffff24;
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[2] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[0];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[3] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[1];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[4] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[2];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[5] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[3];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[6] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[4];
        local_1a0.values.super_array<unsigned_int,_8UL>.elems[7] =
             t_1.values.super_array<unsigned_int,_8UL>.elems[5];
        unique0x100008e0 = uVar3;
        v = uintwide_t<256U,_unsigned_int,_void,_false>::mul_by_limb(&local_1a0,10);
        wide_integer::operator-
                  (&local_180,(uintwide_t<256U,_unsigned_int,_void,_false> *)local_160,v);
        uVar6 = wide_integer::uintwide_t::operator_cast_to_unsigned_int((uintwide_t *)&local_180);
        tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
             tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ + -1;
        pcVar12 = detail::fixed_static_array<char,_87U>::operator[]
                            ((fixed_static_array<char,_87U> *)&pos_1,
                             (size_type_conflict)
                             tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_);
        *pcVar12 = (char)uVar6 + '0';
      }
    }
    if ((0 < (long)tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_) && (show_pos)) {
      tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
           tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ + -1;
      pcVar12 = detail::fixed_static_array<char,_87U>::operator[]
                          ((fixed_static_array<char,_87U> *)&pos_1,
                           (size_type_conflict)
                           tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_);
      *pcVar12 = '+';
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_87UL>::size();
      t_2.values.super_array<unsigned_int,_8UL>.elems._24_8_ = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)
                               (t_2.values.super_array<unsigned_int,_8UL>.elems + 6));
      while (uVar3 = tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_,
            sVar10 = detail::array_detail::array<char,_87UL>::size(), cVar1 = fill_char_str,
            (long)((sVar10 - 1) - field_width) < (long)uVar3) {
        tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
             tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_ + -1;
        pcVar12 = detail::fixed_static_array<char,_87U>::operator[]
                            ((fixed_static_array<char,_87U> *)&pos_1,
                             (size_type_conflict)
                             tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_);
        *pcVar12 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_87UL>::size();
    pcVar12 = detail::fixed_static_array<char,_87U>::operator[]
                        ((fixed_static_array<char,_87U> *)&pos_1,(int)sVar10 - 1);
    *pcVar12 = '\0';
    pcVar13 = detail::array_detail::array<char,_87UL>::data((array<char,_87UL> *)&pos_1);
    detail::strcpy_unsafe<char*,char*>
              (str_result,pcVar13 + tmp.values.super_array<unsigned_int,_8UL>.elems._24_8_);
  }
  else if (base_rep == '\x10') {
    str_temp_2.super_array<char,_72UL>.elems._64_8_ = *(undefined8 *)this;
    t_2.values.super_array<unsigned_int,_8UL>.elems._0_8_ = *(undefined8 *)(this + 8);
    t_2.values.super_array<unsigned_int,_8UL>.elems._8_8_ = *(undefined8 *)(this + 0x10);
    t_2.values.super_array<unsigned_int,_8UL>.elems._16_8_ = *(undefined8 *)(this + 0x18);
    memset(&pos_2,0,0x48);
    detail::fixed_static_array<char,_72U>::fixed_static_array
              ((fixed_static_array<char,_72U> *)&pos_2);
    sVar5 = detail::fixed_static_array<char,_72U>::static_size();
    dst = (unsigned_fast_type)(sVar5 - 1);
    bVar4 = uintwide_t<256U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                       (str_temp_2.super_array<char,_72UL>.elems + 0x40));
    if (bVar4) {
      dst = dst - 1;
      pcVar14 = detail::fixed_static_array<char,_72U>::operator[]
                          ((fixed_static_array<char,_72U> *)&pos_2,(size_type_conflict)dst);
      *pcVar14 = '0';
    }
    else {
      pcVar14 = detail::fixed_static_array<char,_72U>::operator[]
                          ((fixed_static_array<char,_72U> *)&pos_2,(size_type_conflict)dst);
      local_220 = uintwide_t<256U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                            ((uintwide_t<256U,_unsigned_int,_void,_false> *)
                             (str_temp_2.super_array<char,_72UL>.elems + 0x40),pcVar14,is_uppercase)
      ;
      dst = dst - local_220;
    }
    if ((show_base) && (1 < (long)dst)) {
      local_281 = 'X';
      if (!is_uppercase) {
        local_281 = 'x';
      }
      dst = dst - 1;
      pcVar14 = detail::fixed_static_array<char,_72U>::operator[]
                          ((fixed_static_array<char,_72U> *)&pos_2,(size_type_conflict)dst);
      *pcVar14 = local_281;
      dst = dst - 1;
      pcVar14 = detail::fixed_static_array<char,_72U>::operator[]
                          ((fixed_static_array<char,_72U> *)&pos_2,(size_type_conflict)dst);
      *pcVar14 = '0';
    }
    if ((show_pos) && (0 < (long)dst)) {
      dst = dst - 1;
      pcVar14 = detail::fixed_static_array<char,_72U>::operator[]
                          ((fixed_static_array<char,_72U> *)&pos_2,(size_type_conflict)dst);
      *pcVar14 = '+';
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_72UL>::size();
      local_228 = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_228);
      while (uVar2 = dst, sVar10 = detail::array_detail::array<char,_72UL>::size(),
            cVar1 = fill_char_str, (long)((sVar10 - 1) - field_width) < (long)uVar2) {
        dst = dst - 1;
        pcVar14 = detail::fixed_static_array<char,_72U>::operator[]
                            ((fixed_static_array<char,_72U> *)&pos_2,(size_type_conflict)dst);
        *pcVar14 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_72UL>::size();
    pcVar14 = detail::fixed_static_array<char,_72U>::operator[]
                        ((fixed_static_array<char,_72U> *)&pos_2,(int)sVar10 - 1);
    *pcVar14 = '\0';
    pcVar15 = detail::array_detail::array<char,_72UL>::data((array<char,_72UL> *)&pos_2);
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar15 + dst);
  }
  else {
    t.values.super_array<unsigned_int,_8UL>.elems[6]._3_1_ = false;
  }
  return t.values.super_array<unsigned_int,_8UL>.elems[6]._3_1_;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }